

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddImageRounded
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
          ImVec2 *uv_b,ImU32 col,float rounding,int rounding_corners)

{
  int iVar1;
  ImDrawVert *pIVar2;
  bool bVar3;
  value_type *ppvVar4;
  
  if (col < 0x1000000) {
    return;
  }
  if (0.0 < rounding && (rounding_corners & 0xfU) != 0) {
    if (((this->_TextureIdStack).Size == 0) ||
       (ppvVar4 = ImVector<void_*>::back(&this->_TextureIdStack), *ppvVar4 != user_texture_id)) {
      PushTextureID(this,user_texture_id);
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    iVar1 = (this->VtxBuffer).Size;
    PathRect(this,a,b,rounding,rounding_corners);
    PathFillConvex(this,col);
    pIVar2 = (this->VtxBuffer).Data;
    ImGui::ShadeVertsLinearUV(pIVar2 + iVar1,pIVar2 + (this->VtxBuffer).Size,a,b,uv_a,uv_b,true);
    if (!bVar3) {
      return;
    }
    PopTextureID(this);
    return;
  }
  AddImage(this,user_texture_id,a,b,uv_a,uv_b,col);
  return;
}

Assistant:

void ImDrawList::AddImageRounded(ImTextureID user_texture_id, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, ImU32 col, float rounding, int rounding_corners)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    if (rounding <= 0.0f || (rounding_corners & ImDrawCornerFlags_All) == 0)
    {
        AddImage(user_texture_id, a, b, uv_a, uv_b, col);
        return;
    }

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    int vert_start_idx = VtxBuffer.Size;
    PathRect(a, b, rounding, rounding_corners);
    PathFillConvex(col);
    int vert_end_idx = VtxBuffer.Size;
    ImGui::ShadeVertsLinearUV(VtxBuffer.Data + vert_start_idx, VtxBuffer.Data + vert_end_idx, a, b, uv_a, uv_b, true);

    if (push_texture_id)
        PopTextureID();
}